

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  xmlBufPtr pxVar2;
  xmlChar *ret;
  xmlAttrPtr attr;
  xmlNodePtr node;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    if (reader->curnode == (xmlNodePtr)0x0) {
      attr = (xmlAttrPtr)reader->node;
    }
    else {
      attr = (xmlAttrPtr)reader->curnode;
    }
    xVar1 = attr->type;
    if (xVar1 == XML_ATTRIBUTE_NODE) {
      if (((attr->children == (_xmlNode *)0x0) || (attr->children->type != XML_TEXT_NODE)) ||
         (attr->children->next != (_xmlNode *)0x0)) {
        if (reader->buffer == (xmlBufPtr)0x0) {
          pxVar2 = xmlBufCreate(0x32);
          reader->buffer = pxVar2;
          if (reader->buffer == (xmlBufPtr)0x0) {
            return (xmlChar *)0x0;
          }
        }
        else {
          xmlBufEmpty(reader->buffer);
        }
        xmlBufGetNodeContent(reader->buffer,(xmlNode *)attr);
        reader_local = (xmlTextReaderPtr)xmlBufContent(reader->buffer);
        if (reader_local == (xmlTextReaderPtr)0x0) {
          xmlTextReaderErrMemory(reader);
          xmlBufFree(reader->buffer);
          pxVar2 = xmlBufCreate(0x32);
          reader->buffer = pxVar2;
        }
      }
      else {
        reader_local = (xmlTextReaderPtr)attr->children->content;
      }
    }
    else if ((xVar1 - XML_TEXT_NODE < 2) || (xVar1 - XML_PI_NODE < 2)) {
      reader_local = *(xmlTextReaderPtr *)&attr->atype;
    }
    else if (xVar1 == XML_NAMESPACE_DECL) {
      reader_local = (xmlTextReaderPtr)attr->name;
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(((xmlNsPtr) node)->href);
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
	    const xmlChar *ret;

	    if ((attr->children != NULL) &&
	        (attr->children->type == XML_TEXT_NODE) &&
		(attr->children->next == NULL))
		return(attr->children->content);
	    else {
		if (reader->buffer == NULL) {
		    reader->buffer = xmlBufCreate(50);
                    if (reader->buffer == NULL)
                        return (NULL);
                } else
                    xmlBufEmpty(reader->buffer);
	        xmlBufGetNodeContent(reader->buffer, node);
		ret = xmlBufContent(reader->buffer);
		if (ret == NULL) {
                    xmlTextReaderErrMemory(reader);
		    /* error on the buffer best to reallocate */
		    xmlBufFree(reader->buffer);
		    reader->buffer = xmlBufCreate(50);
		}
		return(ret);
	    }
	    break;
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(node->content);
	default:
	    break;
    }
    return(NULL);
}